

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_convolutiondepthwise_mul(NetOptimize *this)

{
  uint uVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  Layer *pLVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar13 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    uVar14 = lVar13 >> 3;
    lVar13 = 0;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      if (iVar10 == 0) {
        uVar16 = lVar13 + 1;
        if (uVar16 < uVar14) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar13]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
            if (((iVar11 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar16],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 8)) && (*piVar4 == iVar10))
            goto LAB_0013215f;
            uVar16 = uVar16 + 1;
          } while (uVar16 < uVar14);
        }
        else {
LAB_0013215f:
          if (uVar16 != uVar14) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar16];
            if ((*(int *)&pLVar3[1]._vptr_Layer == 2) &&
               (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
              pLVar6 = ppLVar5[lVar13];
              uVar17 = 0;
              do {
                iVar10 = std::__cxx11::string::compare
                                   ((char *)&(((this->super_ModelWriter).layers)->
                                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar17]->
                                             type);
                if ((iVar10 == 0) &&
                   (*((((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar17]->tops).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start ==
                    *(int *)(*(long *)&(pLVar3->bottoms).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 4))) {
                  if (uVar16 != uVar17) {
                    pLVar7 = (((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar17];
                    uVar1 = *(uint *)&pLVar6[1]._vptr_Layer;
                    if (((*(uint *)&pLVar7[1]._vptr_Layer == uVar1) &&
                        (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 0)) &&
                       (iVar10._0_1_ = pLVar7[1].support_bf16_storage,
                       iVar10._1_1_ = pLVar7[1].support_fp16_storage,
                       iVar10._2_1_ = pLVar7[1].support_int8_storage,
                       iVar10._3_1_ = pLVar7[1].support_image_storage, iVar10 == 0)) {
                      fprintf(_stderr,"fuse_convolutiondepthwise_mul %s %s\n",
                              (pLVar6->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
                      if (0 < (int)uVar1) {
                        piVar12 = *(pointer *)
                                   ((long)&pLVar6[1].tops.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                   0x10);
                        lVar8 = *(long *)&pLVar6[2].support_tensor_storage;
                        uVar16 = (long)*(int *)((long)&pLVar6[1].type._M_dataplus._M_p + 4) /
                                 (long)(int)uVar1;
                        iVar10 = (int)uVar16;
                        uVar17 = 0;
                        do {
                          if (0 < iVar10) {
                            lVar9 = *(long *)&pLVar7[1].support_reserved_6;
                            uVar15 = 0;
                            do {
                              piVar12[uVar15] =
                                   (int)(*(float *)(lVar9 + uVar17 * 4) * (float)piVar12[uVar15]);
                              uVar15 = uVar15 + 1;
                            } while ((uVar16 & 0xffffffff) != uVar15);
                          }
                          if (lVar8 != 0) {
                            *(float *)(lVar8 + uVar17 * 4) =
                                 *(float *)(lVar8 + uVar17 * 4) *
                                 *(float *)(*(long *)&pLVar7[1].support_reserved_6 + uVar17 * 4);
                          }
                          uVar17 = uVar17 + 1;
                          piVar12 = piVar12 + iVar10;
                        } while (uVar17 != uVar1);
                      }
                      iVar10 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start;
                      *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = iVar10;
                      (((this->super_ModelWriter).blobs)->
                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar10].producer = (int)lVar13;
                      std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
                    }
                  }
                  break;
                }
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != uVar14 + (uVar14 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_mul()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 2 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        if (memorydata->w != channels || memorydata->h != 0 || memorydata->c != 0)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_mul %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        {
            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= memorydata->data[i];
                }

                if (bias)
                {
                    bias[i] = bias[i] * memorydata->data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}